

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::Map::GeneratePrivateMembers(Map *this,Printer *p)

{
  char *pcVar1;
  long lVar2;
  string_view in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  Sub local_198 [2];
  
  if (this->lite_ == true) {
    io::Printer::Emit(p,0x3e,"\n          $pbi$::MapFieldLite<$Key$, $Val$> $name$_;\n        ");
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"kKeyType",(allocator<char> *)&stack0xfffffffffffffde7);
  pcVar1 = DeclaredTypeMethodName((uint)(byte)this->key_[2]);
  strlen(pcVar1);
  absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(in_stack_fffffffffffffdd8);
  io::Printer::Sub::Sub<std::__cxx11::string>(local_198,&local_1b8,&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"kValType",(allocator<char> *)&stack0xfffffffffffffde6);
  pcVar1 = DeclaredTypeMethodName((uint)(byte)this->val_[2]);
  strlen(pcVar1);
  absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(in_stack_fffffffffffffdd8);
  io::Printer::Sub::Sub<std::__cxx11::string>(local_198 + 1,&local_1f8,&local_218);
  google::protobuf::io::Printer::Emit
            (p,local_198,2,0xef,
             "\n              $pbi$::$MapField$<$Entry$, $Key$, $Val$,\n                                $pbi$::WireFormatLite::TYPE_$kKeyType$,\n                                $pbi$::WireFormatLite::TYPE_$kValType$>\n                  $name$_;\n            "
            );
  lVar2 = 0xb8;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_198[0].key_._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0xb8;
  } while (lVar2 != -0xb8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  return;
}

Assistant:

void Map::GeneratePrivateMembers(io::Printer* p) const {
  if (lite_) {
    p->Emit(
        R"cc(
          $pbi$::MapFieldLite<$Key$, $Val$> $name$_;
        )cc");
  } else {
    p->Emit({{"kKeyType",
              absl::AsciiStrToUpper(DeclaredTypeMethodName(key_->type()))},
             {"kValType",
              absl::AsciiStrToUpper(DeclaredTypeMethodName(val_->type()))}},
            R"cc(
              $pbi$::$MapField$<$Entry$, $Key$, $Val$,
                                $pbi$::WireFormatLite::TYPE_$kKeyType$,
                                $pbi$::WireFormatLite::TYPE_$kValType$>
                  $name$_;
            )cc");
  }
}